

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall ddd::DaTrie<false,_true,_false>::push_block_(DaTrie<false,_true,_false> *this)

{
  pointer *ppBVar1;
  pointer *ppNVar2;
  ulong uVar3;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  pointer pBVar4;
  ulong uVar5;
  int iVar6;
  uint32_t block_pos;
  ulong uVar7;
  NodeLink local_3e;
  Block local_3c;
  Bc local_38;
  
  uVar7 = (ulong)((long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  iVar6 = 0x100;
  do {
    local_38 = (Bc)0x0;
    __position._M_current =
         (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::_M_realloc_insert<ddd::Bc>
                (&this->bc_,__position,&local_38);
    }
    else {
      *__position._M_current = (Bc)0x0;
      ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 0x100;
  do {
    local_3e.child = '\0';
    local_3e.sib = '\0';
    __position_00._M_current =
         (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::_M_realloc_insert<ddd::NodeLink>
                (&this->node_links_,__position_00,&local_3e);
    }
    else {
      (__position_00._M_current)->child = '\0';
      (__position_00._M_current)->sib = '\0';
      ppNVar2 = &(this->node_links_).
                 super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  local_3c.num_emps = 0x100;
  __position_01._M_current =
       (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ddd::Block,_std::allocator<ddd::Block>_>::_M_realloc_insert<ddd::Block>
              (&this->blocks_,__position_01,&local_3c);
  }
  else {
    (__position_01._M_current)->num_emps = 0x100;
    (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_01._M_current + 1;
  }
  block_pos = (uint32_t)uVar7;
  if (block_pos * 0x100 != -0x100) {
    uVar5 = (uVar7 << 0x28) + 0x7fffffff00000000;
    uVar7 = (ulong)(block_pos << 8);
    do {
      uVar3 = uVar7 + 1;
      *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start + uVar7) = (uint)uVar3 & 0x7fffffff;
      pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar4[uVar7] = (Bc)((ulong)pBVar4[uVar7] & 0x80000000ffffffff | uVar5 & 0x7fffffff00000000);
      uVar5 = uVar5 + 0x100000000;
      uVar7 = uVar3;
    } while (uVar3 < block_pos * 0x100 + 0x100);
  }
  push_block_(this,block_pos,&this->blocks_);
  this->bc_emps_ = this->bc_emps_ + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }